

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

void Abc_ExactStoreTest(int fVerbose)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  Abc_Ntk_t *pNtk;
  char *pcVar4;
  Vec_Ptr_t *vNames;
  void **ppvVar5;
  Abc_Obj_t *pAVar6;
  long lVar7;
  int Cost;
  char pPerm [4];
  word pTruth [4];
  Abc_Obj_t *pFanins [4];
  int local_80;
  char local_7c [4];
  int local_78 [4];
  word local_68 [4];
  Abc_Obj_t *local_48 [4];
  
  local_68[2] = 0;
  local_68[3] = 0;
  local_68[0] = 0xcafe;
  local_68[1] = 0;
  local_78[0] = 6;
  local_78[1] = 2;
  local_78[2] = 8;
  local_78[3] = 5;
  local_7c[0] = '\0';
  local_7c[1] = '\0';
  local_7c[2] = '\0';
  local_7c[3] = '\0';
  local_80 = 0;
  pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar4 = Extra_UtilStrsav("exact");
  pNtk->pName = pcVar4;
  vNames = Abc_NodeGetFakeNames(4);
  pVVar2 = pNtk->vObjs;
  uVar1 = pVVar2->nSize;
  if (uVar1 == pVVar2->nCap) {
    if ((int)uVar1 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar5;
      pVVar2->nCap = 0x10;
    }
    else {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
      }
      pVVar2->pArray = ppvVar5;
      pVVar2->nCap = uVar1 * 2;
    }
  }
  else {
    ppvVar5 = pVVar2->pArray;
  }
  iVar3 = pVVar2->nSize;
  pVVar2->nSize = iVar3 + 1;
  ppvVar5[iVar3] = (void *)0x0;
  lVar7 = 0;
  do {
    pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
    local_48[lVar7] = pAVar6;
    if (vNames->nSize <= lVar7) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    Abc_ObjAssignName(pAVar6,(char *)vNames->pArray[lVar7],(char *)0x0);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  Abc_NodeFreeNames(vNames);
  Abc_ExactStart(10000,1,fVerbose,0,(char *)0x0);
  pAVar6 = Abc_ExactBuildNode(local_68,4,local_78,local_48,pNtk);
  if (pAVar6 != (Abc_Obj_t *)0x0) {
    __assert_fail("!Abc_ExactBuildNode( pTruth, 4, pArrTimeProfile, pFanins, pNtk )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0xbbc,"void Abc_ExactStoreTest(int)");
  }
  iVar3 = Abc_ExactDelayCost(local_68,4,local_78,local_7c,&local_80,0xc);
  if (iVar3 != 1) {
    __assert_fail("Abc_ExactDelayCost( pTruth, 4, pArrTimeProfile, pPerm, &Cost, 12 ) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0xbbe,"void Abc_ExactStoreTest(int)");
  }
  pAVar6 = Abc_ExactBuildNode(local_68,4,local_78,local_48,pNtk);
  if (pAVar6 != (Abc_Obj_t *)0x0) {
    local_78[0] = 7;
    pAVar6 = Abc_ExactBuildNode(local_68,4,local_78,local_48,pNtk);
    if (pAVar6 == (Abc_Obj_t *)0x0) {
      Abc_ExactStop((char *)0x0);
      Abc_NtkDelete(pNtk);
      return;
    }
    __assert_fail("!Abc_ExactBuildNode( pTruth, 4, pArrTimeProfile, pFanins, pNtk )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0xbc3,"void Abc_ExactStoreTest(int)");
  }
  __assert_fail("Abc_ExactBuildNode( pTruth, 4, pArrTimeProfile, pFanins, pNtk )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                ,0xbc0,"void Abc_ExactStoreTest(int)");
}

Assistant:

void Abc_ExactStoreTest( int fVerbose )
{
    int i;
    word pTruth[4] = {0xcafe, 0, 0, 0};
    int pArrTimeProfile[4] = {6, 2, 8, 5};
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pFanins[4];
    Vec_Ptr_t * vNames;
    char pPerm[4] = {0};
    int Cost = 0;

    pNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    pNtk->pName = Extra_UtilStrsav( "exact" );
    vNames = Abc_NodeGetFakeNames( 4u );

    /* primary inputs */
    Vec_PtrPush( pNtk->vObjs, NULL );
    for ( i = 0; i < 4; ++i )
    {
        pFanins[i] = Abc_NtkCreatePi( pNtk );
        Abc_ObjAssignName( pFanins[i], (char*)Vec_PtrEntry( vNames, i ), NULL );
    }
    Abc_NodeFreeNames( vNames );

    Abc_ExactStart( 10000, 1, fVerbose, 0, NULL );

    assert( !Abc_ExactBuildNode( pTruth, 4, pArrTimeProfile, pFanins, pNtk ) );

    assert( Abc_ExactDelayCost( pTruth, 4, pArrTimeProfile, pPerm, &Cost, 12 ) == 1 );

    assert( Abc_ExactBuildNode( pTruth, 4, pArrTimeProfile, pFanins, pNtk ) );

    (*pArrTimeProfile)++;
    assert( !Abc_ExactBuildNode( pTruth, 4, pArrTimeProfile, pFanins, pNtk ) );
    (*pArrTimeProfile)--;

    Abc_ExactStop( NULL );

    Abc_NtkDelete( pNtk );
}